

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O1

void __thiscall leveldb::log::LogTest::LogTest(LogTest *this)

{
  Writer *this_00;
  Reader *this_01;
  
  (this->dest_).super_WritableFile._vptr_WritableFile = (_func_int **)&PTR__StringDest_001176f8;
  (this->dest_).contents_._M_dataplus._M_p = (pointer)&(this->dest_).contents_.field_2;
  (this->dest_).contents_._M_string_length = 0;
  (this->dest_).contents_.field_2._M_local_buf[0] = '\0';
  (this->source_).super_SequentialFile._vptr_SequentialFile =
       (_func_int **)&PTR__SequentialFile_00117750;
  (this->source_).contents_.data_ = "";
  (this->source_).contents_.size_ = 0;
  (this->source_).force_error_ = false;
  (this->source_).returned_partial_ = false;
  (this->report_).super_Reporter._vptr_Reporter = (_func_int **)&PTR__ReportCollector_00117798;
  (this->report_).dropped_bytes_ = 0;
  (this->report_).message_._M_dataplus._M_p = (pointer)&(this->report_).message_.field_2;
  (this->report_).message_._M_string_length = 0;
  (this->report_).message_.field_2._M_local_buf[0] = '\0';
  this->reading_ = false;
  this_00 = (Writer *)operator_new(0x20);
  Writer::Writer(this_00,(WritableFile *)this);
  this->writer_ = this_00;
  this_01 = (Reader *)operator_new(0x58);
  Reader::Reader(this_01,&(this->source_).super_SequentialFile,&(this->report_).super_Reporter,true,
                 0);
  this->reader_ = this_01;
  return;
}

Assistant:

LogTest()
      : reading_(false),
        writer_(new Writer(&dest_)),
        reader_(new Reader(&source_, &report_, true /*checksum*/,
                           0 /*initial_offset*/)) {}